

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trick.cpp
# Opt level: O2

int __thiscall Trick::getWinner(Trick *this,Contract *c)

{
  int iVar1;
  Card *rhs;
  bool bVar2;
  _List_node_base *p_Var3;
  
  p_Var3 = (this->_cards).
           super__List_base<std::pair<Card_*,_int>,_std::allocator<std::pair<Card_*,_int>_>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  do {
    rhs = (Card *)p_Var3[1]._M_next;
    iVar1 = *(int *)&p_Var3[1]._M_prev;
    do {
      p_Var3 = p_Var3->_M_next;
      if (p_Var3 == (_List_node_base *)&this->_cards) {
        return iVar1;
      }
      bVar2 = Card::isBigger((Card *)p_Var3[1]._M_next,rhs,c);
    } while (!bVar2);
  } while( true );
}

Assistant:

int Trick::getWinner(Contract *c) {
    std::list<pair<Card *, int>>::iterator it = _cards.begin();
    pair<Card *, int> biggest = *it;
    for (++it; it != _cards.end(); ++it) {
        if (it->first->isBigger(biggest.first, c)) {
            biggest = *it;
        }
    }
    return biggest.second;
}